

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::Maybe<kj::OwnFd>_> __thiscall
kj::AsyncCapabilityStream::tryReceiveFd(AsyncCapabilityStream *this)

{
  ResultHolder *pRVar1;
  ResultHolder *pRVar2;
  Own<ResultHolder,_std::nullptr_t>_conflict *other;
  long *in_RSI;
  Own<ResultHolder,_std::nullptr_t> local_50 [2];
  undefined1 local_30 [8];
  Promise<kj::AsyncCapabilityStream::ReadResult> promise;
  Own<ResultHolder,_std::nullptr_t>_conflict result;
  AsyncCapabilityStream *this_local;
  
  heap<kj::AsyncCapabilityStream::tryReceiveFd()::ResultHolder>();
  pRVar1 = Own<ResultHolder,_std::nullptr_t>::operator->
                     ((Own<ResultHolder,_std::nullptr_t> *)&promise);
  pRVar2 = Own<ResultHolder,_std::nullptr_t>::operator->
                     ((Own<ResultHolder,_std::nullptr_t> *)&promise);
  (**(code **)(*in_RSI + 0x78))(local_30,in_RSI,pRVar1,1,1,&pRVar2->fd,1);
  other = mv<kj::Own<kj::AsyncCapabilityStream::tryReceiveFd()::ResultHolder,decltype(nullptr)>>
                    ((Own<ResultHolder,_std::nullptr_t>_conflict *)&promise);
  Own<ResultHolder,_std::nullptr_t>::Own(local_50,other);
  Promise<kj::AsyncCapabilityStream::ReadResult>::
  then<kj::AsyncCapabilityStream::tryReceiveFd()::__0>
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,(Type *)local_30);
  tryReceiveFd()::$_0::~__0((__0 *)local_50);
  Promise<kj::AsyncCapabilityStream::ReadResult>::~Promise
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)local_30);
  Own<ResultHolder,_std::nullptr_t>::~Own((Own<ResultHolder,_std::nullptr_t> *)&promise);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<OwnFd>> AsyncCapabilityStream::tryReceiveFd() {
  struct ResultHolder {
    byte b;
    OwnFd fd;
  };
  auto result = kj::heap<ResultHolder>();
  auto promise = tryReadWithFds(&result->b, 1, 1, &result->fd, 1);
  return promise.then([result = kj::mv(result)](ReadResult actual) mutable
                      -> Maybe<OwnFd> {
    if (actual.byteCount == 0) {
      return kj::none;
    }

    KJ_REQUIRE(actual.capCount == 1,
        "expected to receive a file descriptor (e.g. via SCM_RIGHTS), but didn't") {
      return kj::none;
    }

    return kj::mv(result->fd);
  });
}